

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpassworddigestor.cpp
# Opt level: O2

QByteArray *
QPasswordDigestor::deriveKeyPbkdf2
          (QByteArray *__return_storage_ptr__,Algorithm algorithm,QByteArray *data,QByteArray *salt,
          int iterations,quint64 dkLen)

{
  char *pcVar1;
  Data *pDVar2;
  char *pcVar3;
  qsizetype qVar4;
  int iVar5;
  uint *puVar6;
  char *pcVar7;
  QDebug *pQVar8;
  ulong uVar9;
  storage_type *psVar10;
  long in_FS_OFFSET;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  uint local_f8;
  QArrayDataPointer<char> local_d8;
  QArrayDataPointer<char> local_c0;
  QArrayDataPointer<char> local_a8;
  QArrayDataPointer<char> local_88;
  QMessageAuthenticationCode hmac;
  QArrayDataPointer<char> local_68;
  char *local_50;
  QDebug local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar5 = QCryptographicHash::hashLength(algorithm);
  if ((ulong)((long)iVar5 * 0xfffffffe) < dkLen) {
    local_68.d._0_4_ = 2;
    local_68.size._4_4_ = 0;
    local_68.d._4_4_ = 0;
    local_68.ptr._0_4_ = 0;
    local_68.ptr._4_4_ = 0;
    local_68.size._0_4_ = 0;
    local_50 = "default";
    QMessageLogger::warning();
    *(undefined1 *)&local_a8.d[3].super_QArrayData.ref_._q_value.super___atomic_base<int>._M_i = 0;
    pQVar8 = QDebug::operator<<((QDebug *)&local_a8,"Derived key too long:\n");
    local_40.stream = pQVar8->stream;
    *(int *)(local_40.stream + 0x28) = *(int *)(local_40.stream + 0x28) + 1;
    ::operator<<((Stream *)&local_88,(Algorithm)&local_40);
    pQVar8 = QDebug::operator<<((QDebug *)&local_88," was chosen which produces output of length ");
    pQVar8 = QDebug::operator<<(pQVar8,(long)iVar5 * 0xfffffffe);
    pQVar8 = QDebug::operator<<(pQVar8," but ");
    pQVar8 = QDebug::operator<<(pQVar8,dkLen);
    QDebug::operator<<(pQVar8," was requested.");
    QDebug::~QDebug((QDebug *)&local_88);
    QDebug::~QDebug(&local_40);
    QDebug::~QDebug((QDebug *)&local_a8);
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    if (iterations < 1 || dkLen == 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_001bccf1;
    }
    local_68.d._0_4_ = 0;
    local_68.d._4_4_ = 0;
    local_68.ptr._0_4_ = 0;
    local_68.ptr._4_4_ = 0;
    local_68.size._0_4_ = 0;
    local_68.size._4_4_ = 0;
    _hmac = &DAT_aaaaaaaaaaaaaaaa;
    QVar11.m_data = (data->d).ptr;
    QVar11.m_size = (data->d).size;
    QMessageAuthenticationCode::QMessageAuthenticationCode(&hmac,algorithm,QVar11);
    local_88.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_88.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_88.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QByteArray::QByteArray((QByteArray *)&local_88,4,Uninitialized);
    local_f8 = 1;
    uVar9 = 0;
    while (uVar9 < dkLen) {
      QVar12.m_data = (storage_type *)(salt->d).size;
      QVar12.m_size = (qsizetype)&hmac;
      QMessageAuthenticationCode::addData(QVar12);
      puVar6 = (uint *)QByteArray::data((QByteArray *)&local_88);
      *puVar6 = local_f8 >> 0x18 | (local_f8 & 0xff0000) >> 8 | (local_f8 & 0xff00) << 8 |
                local_f8 << 0x18;
      QVar13.m_data = (storage_type *)local_88.size;
      QVar13.m_size = (qsizetype)&hmac;
      QMessageAuthenticationCode::addData(QVar13);
      local_a8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_a8.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QMessageAuthenticationCode::result();
      QMessageAuthenticationCode::reset();
      local_c0.d = local_a8.d;
      local_c0.ptr = local_a8.ptr;
      local_c0.size = local_a8.size;
      iVar5 = iterations + -1;
      if (local_a8.d != (Data *)0x0) {
        LOCK();
        ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_a8.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      while (iVar5 != 0) {
        QVar14.m_data = (storage_type *)local_a8.size;
        QVar14.m_size = (qsizetype)&hmac;
        QMessageAuthenticationCode::addData(QVar14);
        QMessageAuthenticationCode::result();
        qVar4 = local_a8.size;
        pcVar1 = local_a8.ptr;
        pDVar2 = local_a8.d;
        local_a8.d = local_d8.d;
        local_a8.ptr = local_d8.ptr;
        local_d8.d = pDVar2;
        local_d8.ptr = pcVar1;
        local_a8.size = local_d8.size;
        local_d8.size = qVar4;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_d8);
        QMessageAuthenticationCode::reset();
        pcVar3 = local_a8.ptr;
        pcVar1 = local_c0.ptr;
        psVar10 = (storage_type *)(local_c0.size + (long)local_c0.ptr);
        pcVar7 = QByteArray::data((QByteArray *)&local_c0);
        std::transform<char_const*,char_const*,char*,std::bit_xor<char>>
                  (pcVar1,psVar10,pcVar3,pcVar7);
        iVar5 = iVar5 + -1;
      }
      QByteArray::append((QByteArray *)&local_68);
      local_f8 = local_f8 + 1;
      QArrayDataPointer<char>::~QArrayDataPointer(&local_c0);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_a8);
      uVar9 = CONCAT44(local_68.size._4_4_,(undefined4)local_68.size);
    }
    QByteArray::left(__return_storage_ptr__,(QByteArray *)&local_68,dkLen);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_88);
    QMessageAuthenticationCode::~QMessageAuthenticationCode(&hmac);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_001bccf1:
  __stack_chk_fail();
}

Assistant:

Q_NETWORK_EXPORT QByteArray deriveKeyPbkdf2(QCryptographicHash::Algorithm algorithm,
                                            const QByteArray &data, const QByteArray &salt,
                                            int iterations, quint64 dkLen)
{
    // The RFC recommends checking that 'dkLen' is not greater than '(2^32 - 1) * hLen'
    int hashLen = QCryptographicHash::hashLength(algorithm);
    const quint64 maxLen = quint64(std::numeric_limits<quint32>::max() - 1) * hashLen;
    if (dkLen > maxLen) {
        qWarning().nospace() << "Derived key too long:\n"
                             << algorithm << " was chosen which produces output of length "
                             << maxLen << " but " << dkLen << " was requested.";
        return QByteArray();
    }

    if (iterations < 1 || dkLen < 1)
        return QByteArray();

#ifdef USING_OPENSSL30
    if (methodToName(algorithm))
        return opensslDeriveKeyPbkdf2(algorithm, data, salt, iterations, dkLen);
#endif

    // https://tools.ietf.org/html/rfc8018#section-5.2
    QByteArray key;
    quint32 currentIteration = 1;
    QMessageAuthenticationCode hmac(algorithm, data);
    QByteArray index(4, Qt::Uninitialized);
    while (quint64(key.size()) < dkLen) {
        hmac.addData(salt);

        qToBigEndian(currentIteration, index.data());
        hmac.addData(index);

        QByteArray u = hmac.result();
        hmac.reset();
        QByteArray tkey = u;
        for (int iter = 1; iter < iterations; iter++) {
            hmac.addData(u);
            u = hmac.result();
            hmac.reset();
            std::transform(tkey.cbegin(), tkey.cend(), u.cbegin(), tkey.begin(),
                           std::bit_xor<char>());
        }
        key += tkey;
        currentIteration++;
    }
    return key.left(dkLen);
}